

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-heavy-traffic-deadlock-bug.c
# Opt level: O1

void do_writes_and_reads(uv_stream_t *handle)

{
  int iVar1;
  uv_write_t *req;
  uv_loop_t *puVar2;
  void *pvVar3;
  undefined8 *extraout_RDX;
  long lVar4;
  uv_pipe_t *handle_00;
  uv_write_t *base;
  long lVar5;
  uv_buf_t uVar6;
  uv_pipe_t uStack_178;
  uv_stream_t *puStack_70;
  uv_buf_t local_68 [3];
  
  lVar4 = 0;
  bytes_written = 0;
  bytes_read = 0;
  do {
    puStack_70 = (uv_stream_t *)0x15f0a0;
    req = (uv_write_t *)malloc(0x60c0);
    if (req == (uv_write_t *)0x0) {
      puStack_70 = (uv_stream_t *)0x15f177;
      do_writes_and_reads_cold_6();
LAB_0015f177:
      puStack_70 = (uv_stream_t *)0x15f17c;
      do_writes_and_reads_cold_1();
      goto LAB_0015f17c;
    }
    base = req + 1;
    lVar5 = 8;
    do {
      puStack_70 = (uv_stream_t *)0x15f0ce;
      memset(base,0x2a,0x2000);
      puStack_70 = (uv_stream_t *)0x15f0db;
      uVar6 = uv_buf_init((char *)base,0x2000);
      *(char **)((long)local_68 + lVar5 + -8) = uVar6.base;
      *(size_t *)((long)&local_68[0].base + lVar5) = uVar6.len;
      lVar5 = lVar5 + 0x10;
      base = (uv_write_t *)((long)&base->data + 3);
    } while (lVar5 != 0x38);
    puStack_70 = (uv_stream_t *)0x15f10c;
    iVar1 = uv_write(req,handle,local_68,3,write_cb);
    if (iVar1 != 0) goto LAB_0015f177;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x100);
  puStack_70 = (uv_stream_t *)0x15f136;
  iVar1 = uv_read_start(handle,alloc_cb,read_cb);
  if (iVar1 == 0) {
    puStack_70 = (uv_stream_t *)0x15f145;
    iVar1 = uv_run(handle->loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0015f181;
    if (bytes_written != 0x600000) goto LAB_0015f186;
    if (bytes_read == 0x600000) {
      return;
    }
  }
  else {
LAB_0015f17c:
    puStack_70 = (uv_stream_t *)0x15f181;
    do_writes_and_reads_cold_2();
LAB_0015f181:
    puStack_70 = (uv_stream_t *)0x15f186;
    do_writes_and_reads_cold_3();
LAB_0015f186:
    puStack_70 = (uv_stream_t *)0x15f18b;
    do_writes_and_reads_cold_4();
  }
  puStack_70 = (uv_stream_t *)ipc_helper_heavy_traffic_deadlock_bug;
  do_writes_and_reads_cold_5();
  puStack_70 = handle;
  puVar2 = uv_default_loop();
  handle_00 = &uStack_178;
  iVar1 = uv_pipe_init(puVar2,handle_00,1);
  if (iVar1 == 0) {
    handle_00 = (uv_pipe_t *)0x0;
    iVar1 = uv_pipe_open(&uStack_178,0);
    if (iVar1 == 0) {
      notify_parent_process();
      do_writes_and_reads((uv_stream_t *)&uStack_178);
      uv_sleep(100);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      handle_00 = (uv_pipe_t *)0x0;
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_0015f225;
    }
  }
  else {
    ipc_helper_heavy_traffic_deadlock_bug_cold_1();
  }
  ipc_helper_heavy_traffic_deadlock_bug_cold_2();
LAB_0015f225:
  ipc_helper_heavy_traffic_deadlock_bug_cold_3();
  pvVar3 = malloc((size_t)handle_00);
  *extraout_RDX = pvVar3;
  extraout_RDX[1] = (long)(int)handle_00;
  return;
}

Assistant:

static void do_writes_and_reads(uv_stream_t* handle) {
  size_t i;
  int r;

  bytes_written = 0;
  bytes_read = 0;

  for (i = 0; i < NUM_WRITES; i++) {
    do_write(handle);
  }

  r = uv_read_start(handle, alloc_cb, read_cb);
  ASSERT(r == 0);

  r = uv_run(handle->loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(bytes_written == XFER_SIZE);
  ASSERT(bytes_read == XFER_SIZE);
}